

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_add2hash(FIOBJ dest,char *name,size_t name_len,char *value,size_t value_len,uint8_t encoded
                 )

{
  int iVar1;
  FIOBJ val;
  uint8_t encoded_local;
  size_t value_len_local;
  char *value_local;
  size_t name_len_local;
  char *name_local;
  FIOBJ dest_local;
  
  val = http_str2fiobj(value,value_len,encoded);
  iVar1 = http_add2hash2(dest,name,name_len,val,encoded);
  return iVar1;
}

Assistant:

int http_add2hash(FIOBJ dest, char *name, size_t name_len, char *value,
                  size_t value_len, uint8_t encoded) {
  return http_add2hash2(dest, name, name_len,
                        http_str2fiobj(value, value_len, encoded), encoded);
}